

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O3

void cvode_emit_interface(void)

{
  Symbol *s;
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  Item *pIVar3;
  List *pLVar4;
  Item *pIVar5;
  int i;
  Item *pIVar6;
  char *pcVar7;
  undefined4 uVar8;
  
  if (cvode_not_allowed != 0) {
    lappendstr(defs_list,"\nstatic int _ode_count(int);\n");
    sprintf(buf,
            "\nstatic int _ode_count(int _type){ hoc_execerror(\"%s\", \"cannot be used with CVODE\"); return 0;}\n"
            ,mechname);
    lappendstr(procfunc,buf);
    return;
  }
  if (cvode_emit != 0) {
    lappendstr(defs_list,
               "\nstatic int _ode_count(int);\nstatic void _ode_map(int, double**, double**, double*, Datum*, double*, int);\nstatic void _ode_spec(NrnThread*, Memb_list*, int);\nstatic void _ode_matsol(NrnThread*, Memb_list*, int);\n"
              );
    sprintf(buf,"\nstatic int _ode_count(int _type){ return %d;}\n",(ulong)(uint)cvode_neq_);
    lappendstr(procfunc,buf);
    sprintf(buf,"\n#define _cvode_ieq _ppvar[%d]._i\n",(ulong)(uint)cvode_ieq_index);
    lappendstr(defs_list,buf);
    if (cvode_fun_->subtype == 0x80) {
      cvode_proced_emit();
    }
    else {
      lappendstr(procfunc,"\nstatic void _ode_spec(NrnThread* _nt, Memb_list* _ml, int _type) {\n");
      pLVar4 = procfunc;
      pIVar3 = lappendstr(procfunc,"  ThreadDatum* _thread;\n");
      vectorize_substitute(pIVar3,"  double* _p; Datum* _ppvar; ThreadDatum* _thread;\n");
      lappendstr(pLVar4,
                 "  Node* _nd; double _v; int _iml, _cntml_padded, _cntml_actual;\n  _cntml_actual = _ml->_nodecount;\n  _cntml_padded = _ml->_nodecount_padded;\n  _thread = _ml->_thread;\n  for (_iml = 0; _iml < _cntml_actual; ++_iml) {\n    _p = _ml->_data[_iml]; _ppvar = _ml->_pdata[_iml];\n    _nd = _ml->_nodelist[_iml];\n    v = NODEV(_nd);\n"
                );
      pLVar4 = get_ion_variables(1);
      if (pLVar4->next->itemtype != 0) {
        movelist(pLVar4->next,pLVar4->prev,procfunc);
      }
      sprintf(buf,"    _ode_spec%d",(ulong)(uint)cvode_num_);
      lappendstr(procfunc,buf);
      pIVar3 = lappendstr(procfunc,"();\n");
      vectorize_substitute(pIVar3,"(_threadargs_);\n");
      pLVar4 = set_ion_variables(1);
      if (pLVar4->next->itemtype != 0) {
        movelist(pLVar4->next,pLVar4->prev,procfunc);
      }
      lappendstr(procfunc,"}}\n");
      lappendstr(procfunc,
                 "\nstatic void _ode_map(int _ieq, double** _pv, double** _pvdot, double* _pp, Datum* _ppd, double* _atol, int _type) {"
                );
      pIVar3 = lappendstr(procfunc,"\n");
      vectorize_substitute(pIVar3,"\n\tdouble* _p; Datum* _ppvar;\n");
      sprintf(buf,
              "\tint _i; _p = _pp; _ppvar = _ppd;\n\t_cvode_ieq = _ieq;\n\tfor (_i=0; _i < %d; ++_i) {\n\t\t_pv[_i] = _pp + _slist%d[_i];  _pvdot[_i] = _pp + _dlist%d[_i];\n\t\t_cvode_abstol(_atollist, _atol, _i);\n\t}\n"
              ,(ulong)(uint)cvode_neq_,(ulong)(uint)cvode_num_,(ulong)(uint)cvode_num_);
      lappendstr(procfunc,buf);
      uVar8 = (undefined4)((ulong)in_RAX >> 0x20);
      pIVar3 = useion->next;
      pIVar5 = useion;
      if (pIVar3 != useion) {
        do {
          pIVar3 = pIVar3->next->next;
          pIVar6 = ((pIVar3->element).itm)->next;
          if (pIVar6 != (pIVar3->element).itm) {
            do {
              s = (pIVar6->element).sym;
              if ((s->nrntype & 0x1000) != 0) {
                if ((s->subtype & 0x10) == 0) {
                  if (ion_synonym == (List *)0x0) {
                    ion_synonym = newlist();
                  }
                  pLVar4 = procfunc->next;
                  while( true ) {
                    if (pLVar4 == procfunc) goto LAB_0010b33c;
                    if ((((pLVar4->itemtype == 1) &&
                         ((pLVar4->element).sym == (Symbol *)(pIVar6->element).itm)) &&
                        (pIVar5 = pLVar4->next, pIVar5->itemtype == 1)) &&
                       ((pcVar7 = ((pIVar5->element).sym)->name, *pcVar7 == '=' &&
                        (pcVar7[1] == '\0')))) break;
                    pLVar4 = pLVar4->next;
                  }
                  sprintf(buf,"_ion_%s = ",((pLVar4->element).sym)->name);
                  lappendstr(ion_synonym,buf);
                  do {
                    pIVar5 = pIVar5->next;
                    if (pIVar5 == procfunc->prev) {
LAB_0010b33c:
                      diag(((pIVar6->element).sym)->name,
                           " is WRITE but is not a STATE and has no assignment statement");
                    }
                    lappenditem(ion_synonym,pIVar5);
                  } while ((pIVar5->itemtype != 1) || ((Symbol *)(pIVar5->element).itm != semi));
                }
                else {
                  uVar2 = slist_search(cvode_num_,s);
                  sprintf(buf,"\t_pv[%d] = &(_ion_%s);\n",(ulong)uVar2,((pIVar6->element).sym)->name
                         );
                  lappendstr(procfunc,buf);
                }
              }
              pIVar6 = pIVar6->next;
              pIVar5 = useion;
            } while (pIVar6 != (pIVar3->element).itm);
          }
          uVar8 = (undefined4)((ulong)in_RAX >> 0x20);
          pIVar3 = pIVar3->next->next;
        } while (pIVar3 != pIVar5);
      }
      lappendstr(procfunc,"}\n");
      if (ion_synonym != (List *)0x0) {
        lappendstr(defs_list,"static void _ode_synonym(int, double**, Datum**);\n");
        lappendstr(procfunc,"static void _ode_synonym(int _cnt, double** _pp, Datum** _ppd) {");
        pIVar3 = lappendstr(procfunc,"\n");
        vectorize_substitute(pIVar3,"\n\tdouble* _p; Datum* _ppvar;\n");
        lappendstr(procfunc,
                   "\tint _i; \n\tfor (_i=0; _i < _cnt; ++_i) {_p = _pp[_i]; _ppvar = _ppd[_i];\n");
        movelist(ion_synonym->next,ion_synonym->prev,procfunc);
        lappendstr(procfunc,"}}\n");
      }
      lappendstr(procfunc,"\nstatic void _ode_matsol(NrnThread* _nt, Memb_list* _ml, int _type) {\n"
                );
      pLVar4 = procfunc;
      pIVar3 = lappendstr(procfunc,"  ThreadDatum* _thread;\n");
      vectorize_substitute(pIVar3,"  double* _p; Datum* _ppvar; ThreadDatum* _thread;\n");
      lappendstr(pLVar4,
                 "  Node* _nd; double _v; int _iml, _cntml_padded, _cntml_actual;\n  _cntml_actual = _ml->_nodecount;\n  _cntml_padded = _ml->_nodecount_padded;\n  _thread = _ml->_thread;\n  for (_iml = 0; _iml < _cntml_actual; ++_iml) {\n    _p = _ml->_data[_iml]; _ppvar = _ml->_pdata[_iml];\n    _nd = _ml->_nodelist[_iml];\n    v = NODEV(_nd);\n"
                );
      pLVar4 = get_ion_variables(1);
      if (pLVar4->next->itemtype != 0) {
        movelist(pLVar4->next,pLVar4->prev,procfunc);
      }
      iVar1 = cvode_num_;
      if (cvode_fun_->subtype == 0x400) {
        sprintf(buf,"_cvode_sparse(&_cvsparseobj%d, %d, _dlist%d, _p, _ode_matsol%d, &_coef%d);\n",
                (ulong)(uint)cvode_num_,(ulong)(uint)cvode_neq_,(ulong)(uint)cvode_num_,
                (ulong)(uint)cvode_num_,CONCAT44(uVar8,cvode_num_));
        lappendstr(procfunc,buf);
        sprintf(buf,
                "_cvode_sparse_thread(&_thread[_cvspth%d]._pvoid, %d, _dlist%d, _p, _ode_matsol%d, _ppvar, _thread, _nt);\n"
                ,(ulong)(uint)iVar1,(ulong)(uint)cvode_neq_,(ulong)(uint)iVar1,(ulong)(uint)iVar1);
        pIVar3 = procfunc->prev;
        pcVar7 = buf;
      }
      else {
        sprintf(buf,"_ode_matsol%d",(ulong)(uint)cvode_num_);
        lappendstr(procfunc,buf);
        pIVar3 = lappendstr(procfunc,"();\n");
        pcVar7 = "(_threadargs_);\n";
      }
      vectorize_substitute(pIVar3,pcVar7);
      lappendstr(procfunc,"}}\n");
    }
    if ((state_discon_list_ != (List *)0x0) &&
       (pIVar3 = state_discon_list_->next, pIVar5 = state_discon_list_, pIVar3 != state_discon_list_
       )) {
      do {
        pIVar6 = (pIVar3->element).itm;
        if ((pIVar6->itemtype == 1) && ((((pIVar6->element).sym)->subtype & 0x10) != 0)) {
          uVar2 = slist_search(cvode_num_,(pIVar6->element).sym);
          sprintf(buf,"_cvode_ieq + %d, &",(ulong)uVar2);
          replacstr(pIVar6->prev,buf);
          pIVar5 = state_discon_list_;
        }
        pIVar3 = pIVar3->next;
      } while (pIVar3 != pIVar5);
    }
  }
  return;
}

Assistant:

void cvode_emit_interface() {
	List* lst;
	Item* q, *q1;
	if (cvode_not_allowed) {
		Lappendstr(defs_list, "\n\
static int _ode_count(int);\n");
		sprintf(buf, "\n\
static int _ode_count(int _type){ hoc_execerror(\"%s\", \"cannot be used with CVODE\"); return 0;}\n",
			mechname);
		Lappendstr(procfunc, buf);
	}else if (cvode_emit) {

		Lappendstr(defs_list, "\n\
static int _ode_count(int);\n\
static void _ode_map(int, double**, double**, double*, Datum*, double*, int);\n\
static void _ode_spec(NrnThread*, Memb_list*, int);\n\
static void _ode_matsol(NrnThread*, Memb_list*, int);\n\
");
		sprintf(buf, "\n\
static int _ode_count(int _type){ return %d;}\n",
			cvode_neq_);
		Lappendstr(procfunc, buf);
		sprintf(buf, "\n#define _cvode_ieq _ppvar[%d]._i\n",cvode_ieq_index);
		Lappendstr(defs_list, buf);

   if (cvode_fun_->subtype == PROCED) {
	cvode_proced_emit();
   }else{
		Lappendstr(procfunc, "\nstatic void _ode_spec(NrnThread* _nt, Memb_list* _ml, int _type) {\n");
		out_nt_ml_frag(procfunc);
		lst = get_ion_variables(1);
		if (lst->next->itemtype) movelist(lst->next, lst->prev, procfunc);
		sprintf(buf,"    _ode_spec%d", cvode_num_);
		Lappendstr(procfunc, buf);
		vectorize_substitute(lappendstr(procfunc, "();\n"), "(_threadargs_);\n");
		lst = set_ion_variables(1);
		if (lst->next->itemtype) movelist(lst->next, lst->prev, procfunc);
		Lappendstr(procfunc, "}}\n");

		Lappendstr(procfunc, "\n\
static void _ode_map(int _ieq, double** _pv, double** _pvdot, double* _pp, Datum* _ppd, double* _atol, int _type) {");
		vectorize_substitute(lappendstr(procfunc, "\n"), "\n\
	double* _p; Datum* _ppvar;\n");
		sprintf(buf, "\
	int _i; _p = _pp; _ppvar = _ppd;\n\
	_cvode_ieq = _ieq;\n\
	for (_i=0; _i < %d; ++_i) {\n\
		_pv[_i] = _pp + _slist%d[_i];  _pvdot[_i] = _pp + _dlist%d[_i];\n\
		_cvode_abstol(_atollist, _atol, _i);\n\
	}\n",
			cvode_neq_, cvode_num_, cvode_num_);
		Lappendstr(procfunc, buf);
/* need to take care of case where a state is an ion concentration. Replace
the _pp pointer with a pointer to the actual ion model's concentration */
		cvode_conc_map();
		Lappendstr(procfunc, "}\n"); 
		if (ion_synonym) {
			Lappendstr(defs_list, "static void _ode_synonym(int, double**, Datum**);\n");
			Lappendstr(procfunc, "\
static void _ode_synonym(int _cnt, double** _pp, Datum** _ppd) {");
		vectorize_substitute(lappendstr(procfunc, "\n"), "\n\
	double* _p; Datum* _ppvar;\n");
			Lappendstr(procfunc, "\
	int _i; \n\
	for (_i=0; _i < _cnt; ++_i) {_p = _pp[_i]; _ppvar = _ppd[_i];\n");
			movelist(ion_synonym->next, ion_synonym->prev, procfunc);
			Lappendstr(procfunc, "}}\n");
		}

		Lappendstr(procfunc, "\nstatic void _ode_matsol(NrnThread* _nt, Memb_list* _ml, int _type) {\n");
		out_nt_ml_frag(procfunc);
		lst = get_ion_variables(1);
		if (lst->next->itemtype) movelist(lst->next, lst->prev, procfunc);
		if (cvode_fun_->subtype == KINF) {
			int i = cvode_num_;
sprintf(buf, "_cvode_sparse(&_cvsparseobj%d, %d, _dlist%d, _p, _ode_matsol%d, &_coef%d);\n",
				i, cvode_neq_, i, i, i);
			Lappendstr(procfunc, buf);
sprintf(buf, "_cvode_sparse_thread(&_thread[_cvspth%d]._pvoid, %d, _dlist%d, _p, _ode_matsol%d, _ppvar, _thread, _nt);\n",
				i, cvode_neq_, i, i);
			vectorize_substitute(procfunc->prev, buf);
			
		}else{
			sprintf(buf, "_ode_matsol%d", cvode_num_);
			Lappendstr(procfunc, buf);
			vectorize_substitute(lappendstr(procfunc, "();\n"), "(_threadargs_);\n");
		}
		Lappendstr(procfunc, "}}\n");
	}
	/* handle the state_discontinuities */
	if (state_discon_list_) ITERATE(q, state_discon_list_) {
		Symbol* s;
		int sindex;
		q1 = ITM(q);
		s = SYM(q1);
		if (q1->itemtype == SYMBOL && (s->subtype & STAT)) {
			sindex = slist_search(cvode_num_, s);
			sprintf(buf, "_cvode_ieq + %d, &", sindex);
			replacstr(q1->prev, buf);
		}
	}
   }
}